

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

bool __thiscall
crnlib::
hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
::insert_no_grow(hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
                 *this,insert_result *result,vec<16U,_float> *k,uint *v)

{
  raw_node *prVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  uint uVar10;
  float *this_00;
  uint uVar11;
  ulong uVar12;
  
  if ((this->m_values).m_size == 0) {
    return false;
  }
  uVar10 = hash_key(this,k);
  prVar1 = (this->m_values).m_p;
  this_00 = (float *)(prVar1 + uVar10);
  uVar11 = uVar10;
  if (prVar1[uVar10].m_bits[0x44] == '\0') {
LAB_0016ce3e:
    if (this->m_grow_threshold <= this->m_num_valid) {
      return false;
    }
    uVar2 = *(undefined8 *)k->m_s;
    uVar3 = *(undefined8 *)(k->m_s + 2);
    uVar4 = *(undefined8 *)(k->m_s + 4);
    uVar5 = *(undefined8 *)(k->m_s + 6);
    uVar6 = *(undefined8 *)(k->m_s + 8);
    uVar7 = *(undefined8 *)(k->m_s + 10);
    uVar8 = *(undefined8 *)(k->m_s + 0xe);
    *(undefined8 *)(this_00 + 0xc) = *(undefined8 *)(k->m_s + 0xc);
    *(undefined8 *)(this_00 + 0xe) = uVar8;
    *(undefined8 *)(this_00 + 8) = uVar6;
    *(undefined8 *)(this_00 + 10) = uVar7;
    *(undefined8 *)(this_00 + 4) = uVar4;
    *(undefined8 *)(this_00 + 6) = uVar5;
    *(undefined8 *)this_00 = uVar2;
    *(undefined8 *)(this_00 + 2) = uVar3;
    this_00[0x10] = (float)*v;
    *(undefined1 *)(this_00 + 0x11) = 1;
    this->m_num_valid = this->m_num_valid + 1;
    bVar9 = true;
  }
  else {
    bVar9 = vec<16U,_float>::operator==((vec<16U,_float> *)this_00,k);
    if (bVar9) {
      bVar9 = false;
    }
    else {
      uVar12 = (ulong)uVar10;
      do {
        if ((int)uVar12 == 0) {
          uVar12 = (ulong)((this->m_values).m_size - 1);
          this_00 = (float *)((this->m_values).m_p + uVar12);
        }
        else {
          uVar12 = (ulong)((int)uVar12 - 1);
          this_00 = this_00 + -0x12;
        }
        uVar11 = (uint)uVar12;
        if (uVar10 == uVar11) {
          return false;
        }
        if (*(char *)(this_00 + 0x11) == '\0') goto LAB_0016ce3e;
        bVar9 = vec<16U,_float>::operator==((vec<16U,_float> *)this_00,k);
      } while (!bVar9);
      bVar9 = false;
    }
  }
  (result->first).m_pTable = this;
  (result->first).m_index = uVar11;
  result->second = bVar9;
  return true;
}

Assistant:

inline bool insert_no_grow(insert_result& result, const Key& k, const Value& v = Value())
        {
            if (!m_values.size())
            {
                return false;
            }

            int index = hash_key(k);
            node* pNode = &get_node(index);

            if (pNode->state)
            {
                if (m_equals(pNode->first, k))
                {
                    result.first = iterator(*this, index);
                    result.second = false;
                    return true;
                }

                const int orig_index = index;

                for (;;)
                {
                    if (!index)
                    {
                        index = m_values.size() - 1;
                        pNode = &get_node(index);
                    }
                    else
                    {
                        index--;
                        pNode--;
                    }

                    if (orig_index == index)
                    {
                        return false;
                    }

                    if (!pNode->state)
                    {
                        break;
                    }

                    if (m_equals(pNode->first, k))
                    {
                        result.first = iterator(*this, index);
                        result.second = false;
                        return true;
                    }
                }
            }

            if (m_num_valid >= m_grow_threshold)
            {
                return false;
            }

            construct_value_type(pNode, k, v);

            pNode->state = cStateValid;

            m_num_valid++;
            CRNLIB_ASSERT(m_num_valid <= m_values.size());

            result.first = iterator(*this, index);
            result.second = true;

            return true;
        }